

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QDomNodePrivate ** __thiscall
QMultiHash<QString,_QDomNodePrivate_*>::valueImpl<QString>
          (QMultiHash<QString,_QDomNodePrivate_*> *this,QString *key)

{
  MultiNode<QString,_QDomNodePrivate_*> *pMVar1;
  QString *in_RDI;
  Node *n;
  Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *in_stack_ffffffffffffffe0;
  Chain *local_8;
  
  if (((in_RDI->d).d == (Data *)0x0) ||
     (pMVar1 = QHashPrivate::Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_>::
               findNode<QString>(in_stack_ffffffffffffffe0,in_RDI),
     pMVar1 == (MultiNode<QString,_QDomNodePrivate_*> *)0x0)) {
    local_8 = (Chain *)0x0;
  }
  else {
    local_8 = pMVar1->value;
  }
  return &local_8->value;
}

Assistant:

T *valueImpl(const K &key) const noexcept
    {
        if (d) {
            Node *n = d->findNode(key);
            if (n) {
                Q_ASSERT(n->value);
                return &n->value->value;
            }
        }
        return nullptr;
    }